

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall Js::ByteCodeWriter::Reg2(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  RegSlot R0_00;
  RegSlot R1_00;
  undefined4 *puVar5;
  OpCode op_00;
  undefined1 local_34 [2];
  OpCode local_32 [3];
  ProfileId profileId;
  OpCode op_local;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x2);
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x181,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_007ca6cb;
    *puVar5 = 0;
  }
  R0_00 = ConsumeReg(this,R0);
  R1_00 = ConsumeReg(this,R1);
  op_00 = op;
  if (op == BeginSwitch) {
    bVar3 = false;
    bVar4 = DoDynamicProfileOpcode(this,SwitchOptPhase,false);
    op_00 = BeginSwitch;
    if (bVar4) {
      TVar1 = this->m_functionWrite->profiledSwitchCount;
      if (TVar1 == 0xffff) goto LAB_007ca54b;
      this->m_functionWrite->profiledSwitchCount = TVar1 + 1;
      OpCodeUtil::ConvertNonCallOpToProfiled(local_32);
      bVar3 = true;
      op_00 = op;
    }
  }
  else {
LAB_007ca54b:
    bVar3 = false;
  }
  bVar4 = DoProfileNewScObjArrayOp(this,op_00);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x192,"(DoProfileNewScObjArrayOp(op) == false)",
                                "DoProfileNewScObjArrayOp(op) == false");
    if (!bVar4) goto LAB_007ca6cb;
    *puVar5 = 0;
  }
  bVar4 = DoProfileNewScObjectOp(this,op);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x194,"(DoProfileNewScObjectOp(op) == false)",
                                "DoProfileNewScObjectOp(op) == false");
    if (!bVar4) goto LAB_007ca6cb;
    *puVar5 = 0;
  }
  bVar4 = TryWriteReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,R0_00,R1_00);
  if (!bVar4) {
    local_32[0] = op;
    bVar4 = TryWriteReg2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,R0_00,R1_00);
    if (!bVar4) {
      bVar4 = TryWriteReg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>(this,local_32[0],R0_00,R1_00);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x196,"(success)","success");
        if (!bVar4) {
LAB_007ca6cb:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
  }
  if (bVar3) {
    Data::Write(&this->m_byteCodeData,local_34,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg2(OpCode op, RegSlot R0, RegSlot R1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        bool isProfiled = false;
        bool isProfiled2 = false;
        Js::ProfileId profileId = Js::Constants::NoProfileId;
        Js::ProfileId profileId2 = Js::Constants::NoProfileId;

        if (op == Js::OpCode::BeginSwitch && DoDynamicProfileOpcode(SwitchOptPhase) &&
            this->m_functionWrite->AllocProfiledSwitch(&profileId))
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
        }

        Assert(DoProfileNewScObjArrayOp(op) == false);

        Assert(DoProfileNewScObjectOp(op) == false);

        MULTISIZE_LAYOUT_WRITE(Reg2, op, R0, R1);

        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
            if (isProfiled2)
            {
                m_byteCodeData.Encode(&profileId2, sizeof(Js::ProfileId));
            }
        }
    }